

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O2

bool __thiscall
Lib::
FilteredIterator<Lib::List<Saturation::ExtensionalityClause>::DelIterator,_Saturation::ExtensionalityClauseContainer::ActiveFilterFn,_true>
::hasNext(FilteredIterator<Lib::List<Saturation::ExtensionalityClause>::DelIterator,_Saturation::ExtensionalityClauseContainer::ActiveFilterFn,_true>
          *this)

{
  uint *puVar1;
  List<Saturation::ExtensionalityClause> *pLVar2;
  Clause *pCVar3;
  Literal *pLVar4;
  uint64_t uVar5;
  List<Saturation::ExtensionalityClause> **ppLVar6;
  List<Saturation::ExtensionalityClause> **ppLVar7;
  
  if ((this->_next).super_OptionBase<Saturation::ExtensionalityClause>._isSome == false) {
    while( true ) {
      ppLVar6 = (this->_inn)._lst;
      pLVar2 = (this->_inn)._cur;
      ppLVar7 = &pLVar2->_tail;
      if (pLVar2 == (List<Saturation::ExtensionalityClause> *)0x0) {
        ppLVar7 = ppLVar6;
      }
      if (*ppLVar7 == (List<Saturation::ExtensionalityClause> *)0x0) {
        return false;
      }
      if (pLVar2 != (List<Saturation::ExtensionalityClause> *)0x0) {
        (this->_inn)._prev = pLVar2;
        ppLVar6 = &pLVar2->_tail;
      }
      pLVar2 = *ppLVar6;
      (this->_inn)._cur = pLVar2;
      pCVar3 = (pLVar2->_head).clause;
      if (((uint)*(ulong *)&pCVar3->field_0x38 & 0xe000000) == 0x2000000) break;
      *(ulong *)&pCVar3->field_0x38 = *(ulong *)&pCVar3->field_0x38 & 0xffffffffffbfffff;
      puVar1 = &((this->_func)._parent)->_size;
      *puVar1 = *puVar1 - 1;
      List<Saturation::ExtensionalityClause>::DelIterator::del(&this->_inn);
    }
    pLVar4 = (pLVar2->_head).literal;
    uVar5 = (pLVar2->_head).sort._content;
    (this->_next).super_OptionBase<Saturation::ExtensionalityClause>._elem._elem.init.clause =
         pCVar3;
    (this->_next).super_OptionBase<Saturation::ExtensionalityClause>._elem._elem.init.literal =
         pLVar4;
    (this->_next).super_OptionBase<Saturation::ExtensionalityClause>._elem._elem.init.sort._content
         = uVar5;
    (this->_next).super_OptionBase<Saturation::ExtensionalityClause>._isSome = true;
  }
  return true;
}

Assistant:

bool hasNext()
  {
    if(_next.isSome()) {
      return true;
    }
    while(_inn.hasNext()) {
      OWN_ELEMENT_TYPE next = move_if_value<OWN_ELEMENT_TYPE>(_inn.next());
      if(_func(next)) {
        _next = Option<OWN_ELEMENT_TYPE>(move_if_value<OWN_ELEMENT_TYPE>(next));
        return true;
      } else {
        __doDeletion<deleteFilteredOut>{}(_inn);
      }
    }
    return false;
  }